

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMDBitSet.hpp
# Opt level: O0

OpenMDBitSet * __thiscall OpenMD::OpenMDBitSet::operator-=(OpenMDBitSet *this,OpenMDBitSet *bs)

{
  OpenMDBitSet *in_RDI;
  OpenMDBitSet tmp;
  OpenMDBitSet *this_00;
  OpenMDBitSet *in_stack_ffffffffffffffd0;
  OpenMDBitSet *in_stack_ffffffffffffffd8;
  
  this_00 = (OpenMDBitSet *)&stack0xffffffffffffffc8;
  operator^(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  operator&=(this_00,in_RDI);
  ~OpenMDBitSet((OpenMDBitSet *)0x358515);
  return in_RDI;
}

Assistant:

OpenMDBitSet& operator-=(const OpenMDBitSet& bs) {
      OpenMDBitSet tmp = *this ^ bs;
      *this &= tmp;
      return *this;
    }